

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology_column.h
# Opt level: O0

bool Gudhi::persistent_cohomology::operator<
               (Persistent_cohomology_column<unsigned_int,_int> *c1,
               Persistent_cohomology_column<unsigned_int,_int> *c2)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  pointer pPVar4;
  bool local_49;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  const_iterator it2;
  const_iterator it1;
  Persistent_cohomology_column<unsigned_int,_int> *c2_local;
  Persistent_cohomology_column<unsigned_int,_int> *c1_local;
  
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
  ::begin((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
           *)&it2);
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
  ::begin((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
           *)(local_38 + 8));
  while( true ) {
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
    ::end((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
           *)local_38);
    bVar3 = boost::intrusive::operator!=
                      (&it2,(list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
                             *)local_38);
    local_49 = false;
    if (bVar3) {
      boost::intrusive::
      list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
      ::end((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
             *)(local_48 + 8));
      local_49 = boost::intrusive::operator!=
                           ((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
                             *)(local_38 + 8),
                            (list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
                             *)(local_48 + 8));
    }
    if (local_49 == false) {
      boost::intrusive::
      list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
      ::end((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
             *)local_48);
      bVar3 = boost::intrusive::operator!=
                        ((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
                          *)(local_38 + 8),
                         (list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
                          *)local_48);
      return bVar3;
    }
    pPVar4 = boost::intrusive::
             list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
             ::operator->(&it2);
    uVar1 = pPVar4->key_;
    pPVar4 = boost::intrusive::
             list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
             ::operator->((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
                           *)(local_38 + 8));
    if (uVar1 != pPVar4->key_) {
      pPVar4 = boost::intrusive::
               list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
               ::operator->(&it2);
      uVar1 = pPVar4->key_;
      pPVar4 = boost::intrusive::
               list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
               ::operator->((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
                             *)(local_38 + 8));
      return uVar1 < pPVar4->key_;
    }
    pPVar4 = boost::intrusive::
             list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
             ::operator->(&it2);
    iVar2 = pPVar4->coefficient_;
    pPVar4 = boost::intrusive::
             list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
             ::operator->((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
                           *)(local_38 + 8));
    if (iVar2 != pPVar4->coefficient_) break;
    boost::intrusive::
    list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
    ::operator++(&it2);
    boost::intrusive::
    list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
    ::operator++((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
                  *)(local_38 + 8));
  }
  pPVar4 = boost::intrusive::
           list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
           ::operator->(&it2);
  iVar2 = pPVar4->coefficient_;
  pPVar4 = boost::intrusive::
           list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
           ::operator->((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
                         *)(local_38 + 8));
  return iVar2 < pPVar4->coefficient_;
}

Assistant:

bool operator<(const Persistent_cohomology_column& c1,
                        const Persistent_cohomology_column& c2) {
    typename Col_type::const_iterator it1 = c1.col_.begin();
    typename Col_type::const_iterator it2 = c2.col_.begin();
    while (it1 != c1.col_.end() && it2 != c2.col_.end()) {
      if (it1->key_ == it2->key_) {
        if (it1->coefficient_ == it2->coefficient_) {
          ++it1;
          ++it2;
        } else {
          return it1->coefficient_ < it2->coefficient_;
        }
      } else {
        return it1->key_ < it2->key_;
      }
    }
    return (it2 != c2.col_.end());
  }